

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool Dominates(VmBlock *a,VmBlock *b)

{
  VmBlock **ppVVar1;
  VmBlock *a_00;
  bool bVar2;
  ulong uVar3;
  
  bVar2 = true;
  if (a != b) {
    if ((a->dominanceChildren).count != 0) {
      ppVVar1 = (a->dominanceChildren).data;
      uVar3 = 0;
      do {
        a_00 = ppVVar1[uVar3];
        if (a_00 == b) {
          return true;
        }
        bVar2 = Dominates(a_00,b);
        if (bVar2) {
          return true;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (a->dominanceChildren).count);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Dominates(VmBlock *a, VmBlock *b)
{
	if(a == b)
		return true;

	for(unsigned i = 0; i < a->dominanceChildren.size(); i++)
	{
		VmBlock *child = a->dominanceChildren[i];

		if(child == b)
			return true;

		if(Dominates(child, b))
			return true;
	}

	return false;
}